

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O2

bool deqp::gles3::Functional::rangesIntersect(IVec2 *a,IVec2 *b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = a->m_data[0];
  iVar2 = b->m_data[0];
  iVar3 = b->m_data[1] + iVar2;
  if ((iVar1 < iVar2 || iVar3 < iVar1) &&
     ((iVar4 = a->m_data[1] + iVar1, iVar4 < iVar2 || (iVar2 < iVar1 && iVar3 < iVar4)))) {
    return iVar3 <= iVar4 && iVar1 <= iVar3;
  }
  return true;
}

Assistant:

T						x			(void) const { return m_data[0]; }